

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Plane *item)

{
  ostream *poVar1;
  string local_40;
  
  poVar1 = std::operator<<(os,"plane name: ");
  poVar1 = std::operator<<(poVar1,(string *)item);
  poVar1 = std::operator<<(poVar1,"\ncategory: ");
  PLANE_CATE_convert_abi_cxx11_(&local_40,item->category);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"\nairSupremacy: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,item->airSupremacy);
  poVar1 = std::operator<<(poVar1,"\ntorpedoAttack: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,item->torpedoAtk);
  poVar1 = std::operator<<(poVar1,"\nbombAttack: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,item->bombAtk);
  poVar1 = std::operator<<(poVar1,"\naccuracy");
  std::ostream::operator<<(poVar1,item->accuracy);
  std::__cxx11::string::~string((string *)&local_40);
  return os;
}

Assistant:

ostream &operator<<(ostream &os,Plane &item){
    os<<"plane name: "<<item.name<<"\ncategory: "<<PLANE_CATE_convert(item.category)<<"\nairSupremacy: "<<item.airSupremacy<<"\ntorpedoAttack: "<<item.torpedoAtk<<"\nbombAttack: "<<item.bombAtk<<"\naccuracy"<<item.accuracy;
    return os;
}